

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::double_writer>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
           *this,align_spec *spec,double_writer *f)

{
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar1;
  size_t sVar2;
  ulong uVar3;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  *pbVar4;
  ulong uVar5;
  ulong uVar6;
  char __tmp;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar7;
  ulong uVar8;
  ulong uVar9;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar8 = (ulong)spec->width_;
  sVar2 = f->buffer->size_;
  uVar5 = (ulong)(f->sign != '\0');
  uVar6 = sVar2 + uVar5;
  uVar13 = uVar8 - uVar6;
  if (uVar8 < uVar6 || uVar13 == 0) {
LAB_001611d0:
    double_writer::operator()
              ((double_writer *)f,
               (truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    return;
  }
  bVar1 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
            *)&spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar12 = uVar13 >> 1;
    pbVar4 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               **)this;
    uVar3 = *(ulong *)(this + 8);
    uVar6 = *(ulong *)(this + 0x10);
    bVar7 = this[0x18];
    uVar9 = uVar12;
    bVar10 = bVar7;
    if (1 < uVar13) {
      do {
        bVar7 = bVar1;
        if (uVar6 < uVar3) {
          *pbVar4 = bVar1;
          bVar7 = bVar10;
        }
        pbVar4 = pbVar4 + (uVar6 < uVar3);
        uVar6 = uVar6 + 1;
        uVar9 = uVar9 - 1;
        bVar10 = bVar7;
      } while (uVar9 != 0);
    }
    *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
      **)this = pbVar4;
    *(ulong *)(this + 8) = uVar3;
    *(ulong *)(this + 0x10) = uVar6;
    this[0x18] = bVar7;
    double_writer::operator()
              ((double_writer *)f,
               (truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    pbVar4 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               **)this;
    uVar3 = *(ulong *)(this + 8);
    uVar6 = *(ulong *)(this + 0x10);
    bVar7 = this[0x18];
    if (uVar13 != uVar12) {
      lVar11 = (sVar2 + uVar12 + uVar5) - uVar8;
      bVar10 = bVar7;
      do {
        bVar7 = bVar1;
        if (uVar6 < uVar3) {
          *pbVar4 = bVar1;
          bVar7 = bVar10;
        }
        pbVar4 = pbVar4 + (uVar6 < uVar3);
        uVar6 = uVar6 + 1;
        lVar11 = lVar11 + 1;
        bVar10 = bVar7;
      } while (lVar11 != 0);
    }
    *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
      **)this = pbVar4;
    *(ulong *)(this + 8) = uVar3;
    *(ulong *)(this + 0x10) = uVar6;
    this[0x18] = bVar7;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      pbVar4 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
                 **)this;
      uVar3 = *(ulong *)(this + 8);
      uVar5 = *(ulong *)(this + 0x10);
      bVar7 = this[0x18];
      if (uVar13 != 0) {
        lVar11 = uVar6 - uVar8;
        bVar10 = bVar7;
        do {
          bVar7 = bVar1;
          if (uVar5 < uVar3) {
            *pbVar4 = bVar1;
            bVar7 = bVar10;
          }
          pbVar4 = pbVar4 + (uVar5 < uVar3);
          uVar5 = uVar5 + 1;
          lVar11 = lVar11 + 1;
          bVar10 = bVar7;
        } while (lVar11 != 0);
      }
      *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
        **)this = pbVar4;
      *(ulong *)(this + 8) = uVar3;
      *(ulong *)(this + 0x10) = uVar5;
      this[0x18] = bVar7;
      goto LAB_001611d0;
    }
    double_writer::operator()
              ((double_writer *)f,
               (truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    pbVar4 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               **)this;
    uVar3 = *(ulong *)(this + 8);
    uVar5 = *(ulong *)(this + 0x10);
    bVar7 = this[0x18];
    if (uVar13 != 0) {
      lVar11 = uVar6 - uVar8;
      bVar10 = bVar7;
      do {
        bVar7 = bVar1;
        if (uVar5 < uVar3) {
          *pbVar4 = bVar1;
          bVar7 = bVar10;
        }
        pbVar4 = pbVar4 + (uVar5 < uVar3);
        uVar5 = uVar5 + 1;
        lVar11 = lVar11 + 1;
        bVar10 = bVar7;
      } while (lVar11 != 0);
    }
    *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
      **)this = pbVar4;
    *(ulong *)(this + 8) = uVar3;
    *(ulong *)(this + 0x10) = uVar5;
    this[0x18] = bVar7;
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }